

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

void FILECleanUpLockedRgn(SHMPTR shmFileLocks,DWORD dwAccessRights,PVOID pvControllerInstance)

{
  DWORD DVar1;
  undefined4 uVar2;
  DWORD DVar3;
  UINT UVar4;
  bool bVar5;
  SHMPTR local_50;
  SHMPTR shmcurLockRgn;
  SHMFILELOCKS *nextFileLocks;
  SHMFILELOCKS *prevFileLocks;
  SHMFILELOCKS *fileLocks;
  SHMFILELOCKRGNS *prevLock;
  SHMFILELOCKRGNS *curLockRgn;
  PVOID pvControllerInstance_local;
  DWORD dwAccessRights_local;
  SHMPTR shmFileLocks_local;
  
  fileLocks = (SHMFILELOCKS *)0x0;
  SHMLock();
  if (shmFileLocks == 0) {
    prevFileLocks = (SHMFILELOCKS *)0x0;
    bVar5 = true;
  }
  else {
    prevFileLocks = (SHMFILELOCKS *)SHMPtrToPtr(shmFileLocks);
    bVar5 = prevFileLocks != (SHMFILELOCKS *)0x0;
  }
  if (bVar5) {
    if (prevFileLocks != (SHMFILELOCKS *)0x0) {
      if (prevFileLocks->fileLockedRgns == 0) {
LAB_00147644:
        if ((dwAccessRights & 0x80000000) != 0) {
          prevFileLocks->nbReadAccess = prevFileLocks->nbReadAccess + -1;
        }
        if ((dwAccessRights & 0x40000000) != 0) {
          prevFileLocks->nbWriteAccess = prevFileLocks->nbWriteAccess + -1;
        }
        UVar4 = prevFileLocks->refCount - 1;
        prevFileLocks->refCount = UVar4;
        if ((UVar4 == 0) && (prevFileLocks->fileLockedRgns == 0)) {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          if (prevFileLocks->prev == 0) {
            nextFileLocks = (SHMFILELOCKS *)0x0;
            bVar5 = true;
          }
          else {
            nextFileLocks = (SHMFILELOCKS *)SHMPtrToPtr(prevFileLocks->prev);
            bVar5 = nextFileLocks != (SHMFILELOCKS *)0x0;
          }
          if (bVar5) {
            if (prevFileLocks->next == 0) {
              shmcurLockRgn = 0;
              bVar5 = true;
            }
            else {
              shmcurLockRgn = (SHMPTR)SHMPtrToPtr(prevFileLocks->next);
              bVar5 = (LPVOID)shmcurLockRgn != (LPVOID)0x0;
            }
            if (bVar5) {
              if (nextFileLocks == (SHMFILELOCKS *)0x0) {
                SHMSetInfo(SIID_FILE_LOCKS,prevFileLocks->next);
              }
              else {
                nextFileLocks->next = prevFileLocks->next;
              }
              if (shmcurLockRgn != 0) {
                *(SHMPTR *)(shmcurLockRgn + 0x20) = prevFileLocks->prev;
              }
              if (prevFileLocks->unix_filename != 0) {
                SHMfree(prevFileLocks->unix_filename);
              }
              SHMfree(shmFileLocks);
              goto LAB_001477e8;
            }
          }
          fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x3ec);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        }
      }
      else {
        local_50 = prevFileLocks->fileLockedRgns;
        if (local_50 == 0) {
          prevLock = (SHMFILELOCKRGNS *)0x0;
          bVar5 = true;
        }
        else {
          prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(local_50);
          bVar5 = prevLock != (SHMFILELOCKRGNS *)0x0;
        }
        if (bVar5) {
          do {
            while( true ) {
              while( true ) {
                if (prevLock == (SHMFILELOCKRGNS *)0x0) goto LAB_00147644;
                if ((prevLock->pvControllerInstance == pvControllerInstance) &&
                   (DVar1 = prevLock->processId, DVar3 = GetCurrentProcessId(), DVar1 == DVar3))
                break;
                fileLocks = (SHMFILELOCKS *)prevLock;
                local_50 = prevLock->next;
                if (local_50 == 0) {
                  prevLock = (SHMFILELOCKRGNS *)0x0;
                  bVar5 = true;
                }
                else {
                  prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(local_50);
                  bVar5 = prevLock != (SHMFILELOCKRGNS *)0x0;
                }
                if (!bVar5) {
                  fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
                          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                          ,0x3d4);
                  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
                  goto LAB_001477e8;
                }
              }
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if (fileLocks != (SHMFILELOCKS *)0x0) break;
              prevFileLocks->fileLockedRgns = prevLock->next;
              SHMfree(local_50);
              local_50 = prevFileLocks->fileLockedRgns;
              if (local_50 == 0) {
                prevLock = (SHMFILELOCKRGNS *)0x0;
                bVar5 = true;
              }
              else {
                prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(local_50);
                bVar5 = prevLock != (SHMFILELOCKRGNS *)0x0;
              }
              if (!bVar5) {
                fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
                        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                        ,0x3be);
                fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
                goto LAB_001477e8;
              }
            }
            uVar2 = *(undefined4 *)((long)&prevLock->next + 4);
            fileLocks->share_mode = *(undefined4 *)&prevLock->next;
            fileLocks->nbReadAccess = uVar2;
            SHMfree(local_50);
            local_50._0_4_ = fileLocks->share_mode;
            local_50._4_4_ = fileLocks->nbReadAccess;
            if (local_50 == 0) {
              prevLock = (SHMFILELOCKRGNS *)0x0;
              bVar5 = true;
            }
            else {
              prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(local_50);
              bVar5 = prevLock != (SHMFILELOCKRGNS *)0x0;
            }
          } while (bVar5);
          fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x3c9);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        }
        else {
          fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x3a9);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        }
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","FILECleanUpLockedRgn",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x39e);
    fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  }
LAB_001477e8:
  SHMRelease();
  return;
}

Assistant:

void
FILECleanUpLockedRgn(
    SHMPTR shmFileLocks,
    DWORD dwAccessRights,
    PVOID pvControllerInstance
    )
{
    SHMFILELOCKRGNS *curLockRgn = NULL, *prevLock = NULL;
    SHMFILELOCKS *fileLocks, *prevFileLocks, *nextFileLocks;
    SHMPTR shmcurLockRgn;    

    SHMLock();

    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        goto EXIT;
    }

    if (fileLocks != NULL)
    {
        if(fileLocks->fileLockedRgns !=0)
        {        
            shmcurLockRgn = fileLocks->fileLockedRgns;
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }
            
            while(curLockRgn != NULL)
            {
                if ((curLockRgn->pvControllerInstance == pvControllerInstance) && 
                    (curLockRgn->processId == GetCurrentProcessId()))
                {
                    /* found the locked rgn to remove from SHM */
                    TRACE("Removing the locked region (%I64u, %I64u) from SMH\n", 
                          curLockRgn->lockRgnStart, curLockRgn->nbBytesLocked);
                    
                    if (prevLock == NULL) 
                    {
                        /* removing the first lock */
                        fileLocks->fileLockedRgns = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = fileLocks->fileLockedRgns;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    else
                    {
                        prevLock->next = curLockRgn->next;
                        SHMfree(shmcurLockRgn);
                        shmcurLockRgn = prevLock->next;
                        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                        {
                            ASSERT("Unable to get pointer from shm pointer.\n");
                            goto EXIT;
                        }
                    }
                    continue;
                }
                
                prevLock = curLockRgn;
                shmcurLockRgn = curLockRgn->next;
                if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
                {
                    ASSERT("Unable to get pointer from shm pointer.\n");
                    goto EXIT;
                }
            }
        }
    
        if (dwAccessRights & GENERIC_READ)
        {   
            fileLocks->nbReadAccess--;      
        }
        if (dwAccessRights & GENERIC_WRITE)
        {
            fileLocks->nbWriteAccess--; 
        }  

        /* remove the SHMFILELOCKS structure from SHM if there's no more locked 
           region left and no more reference to it */        
        if ((--(fileLocks->refCount) == 0) && (fileLocks->fileLockedRgns == 0))
        {            
            TRACE("Removing the SHMFILELOCKS structure from SHM\n");

            if ( (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, prevFileLocks, fileLocks->prev) == FALSE) ||
                 (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, nextFileLocks, fileLocks->next) == FALSE))
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                goto EXIT;
            }

            if (prevFileLocks == NULL) 
            {
                /* removing the first lock file*/
                SHMSetInfo(SIID_FILE_LOCKS, fileLocks->next);
            }
            else
            {
                prevFileLocks->next = fileLocks->next;
            }

            if (nextFileLocks != NULL)
            {
                nextFileLocks->prev = fileLocks->prev;
            }

            if (fileLocks->unix_filename)
                SHMfree(fileLocks->unix_filename);

            SHMfree(shmFileLocks);
        }
    }    
EXIT:
    SHMRelease();
    return;
}